

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

string * __thiscall
CodeGen::generateRecordType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  string *psVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var6;
  undefined4 extraout_var_01;
  ostream *poVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  _Base_ptr p_Var8;
  size_t i;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  string decoratedName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  char local_81;
  ulong local_80;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_40;
  ulong local_38;
  
  local_40 = __return_storage_ptr__;
  iVar5 = (*n->px->_vptr_Node[4])();
  local_80 = CONCAT44(extraout_var,iVar5);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_80 != 0) {
    uVar9 = 0;
    do {
      iVar5 = (*n->px->_vptr_Node[5])(n->px,uVar9 & 0xffffffff);
      generateType_abi_cxx11_(&local_78,this,(NodePtr *)CONCAT44(extraout_var_00,iVar5));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
    } while (local_80 != uVar9);
  }
  psVar4 = local_40;
  p_Var8 = (this->done)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = &(this->done)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (_Base_ptr)(n->pn).pi_;
    p_Var6 = &p_Var1->_M_header;
    do {
      bVar11 = p_Var8[1]._M_parent < p_Var2;
      if (!bVar11) {
        p_Var6 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar11];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var6[1]._M_parent <= p_Var2)) {
      (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,p_Var6[1]._M_left,
                 (long)&(p_Var6[1]._M_right)->_M_color + (long)p_Var6[1]._M_left);
      goto LAB_00146642;
    }
  }
  iVar5 = (*n->px->_vptr_Node[3])();
  lVar10 = *(long *)(CONCAT44(extraout_var_01,iVar5) + 0x20);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,lVar10,*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x28) + lVar10);
  poVar7 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"struct ",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," {\n",3);
  if ((local_80 == 0) || (this->noUnion_ != false)) {
    if (local_80 != 0) goto LAB_00146324;
  }
  else {
    lVar10 = 8;
    uVar9 = 0;
    do {
      iVar5 = (*n->px->_vptr_Node[5])(n->px,uVar9 & 0xffffffff);
      if (*(int *)(*(long *)CONCAT44(extraout_var_02,iVar5) + 8) == 0xc) {
        poVar7 = this->os_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    typedef ",0xc);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)((long)local_58.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             lVar10 + -8),
                            *(long *)((long)&((local_58.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
        local_81 = ' ';
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_81,1);
        iVar5 = (*n->px->_vptr_Node[8])(n->px,uVar9 & 0xffffffff);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)CONCAT44(extraout_var_03,iVar5),
                            ((undefined8 *)CONCAT44(extraout_var_03,iVar5))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_t;\n",4);
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (local_80 != uVar9);
LAB_00146324:
    lVar10 = 8;
    uVar9 = 0;
    do {
      if ((this->noUnion_ == false) &&
         (iVar5 = (*n->px->_vptr_Node[5])(n->px,uVar9 & 0xffffffff),
         *(int *)(*(long *)CONCAT44(extraout_var_04,iVar5) + 8) == 0xc)) {
        poVar7 = this->os_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
        iVar5 = (*n->px->_vptr_Node[8])(n->px,uVar9 & 0xffffffff);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)CONCAT44(extraout_var_05,iVar5),
                            ((undefined8 *)CONCAT44(extraout_var_05,iVar5))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_t",2);
      }
      else {
        poVar7 = this->os_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,*(char **)((long)local_58.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                   *(long *)((long)&((local_58.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar10));
      }
      local_81 = ' ';
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_81,1);
      iVar5 = (*n->px->_vptr_Node[8])(n->px,uVar9 & 0xffffffff);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_06,iVar5),
                          ((undefined8 *)CONCAT44(extraout_var_06,iVar5))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n",2);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (local_80 != uVar9);
  }
  poVar7 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
  if (local_80 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os_," :",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
  if (local_80 != 0) {
    local_38 = local_80 - 1;
    lVar10 = 8;
    uVar9 = 0;
    do {
      poVar7 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        ",8);
      iVar5 = (*n->px->_vptr_Node[8])(n->px,uVar9 & 0xffffffff);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_07,iVar5),
                          ((undefined8 *)CONCAT44(extraout_var_07,iVar5))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      if ((this->noUnion_ == false) &&
         (iVar5 = (*n->px->_vptr_Node[5])(n->px,uVar9 & 0xffffffff),
         *(int *)(*(long *)CONCAT44(extraout_var_08,iVar5) + 8) == 0xc)) {
        poVar7 = this->os_;
        iVar5 = (*n->px->_vptr_Node[8])(n->px,uVar9 & 0xffffffff);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)CONCAT44(extraout_var_09,iVar5),
                            ((undefined8 *)CONCAT44(extraout_var_09,iVar5))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_t",2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->os_,
                   *(char **)((long)local_58.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                   *(long *)((long)&((local_58.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar10));
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os_,"())",3);
      if (local_38 != uVar9) {
        local_81 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_81,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (local_80 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"        { }\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"};\n\n",4);
  iVar5 = (*n->px->_vptr_Node[3])();
  lVar10 = *(long *)(CONCAT44(extraout_var_10,iVar5) + 0x20);
  lVar3 = *(long *)(CONCAT44(extraout_var_10,iVar5) + 0x28);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)psVar4,lVar10,lVar3 + lVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_00146642:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return psVar4;
}

Assistant:

string CodeGen::generateRecordType(const NodePtr& n)
{
    size_t c = n->leaves();
    vector<string> types;
    for (size_t i = 0; i < c; ++i) {
        types.push_back(generateType(n->leafAt(i)));
    }

    map<NodePtr, string>::const_iterator it = done.find(n);
    if (it != done.end()) {
        return it->second;
    }

    string decoratedName = decorate(n->name());
    os_ << "struct " << decoratedName << " {\n";
    if (! noUnion_) {
        for (size_t i = 0; i < c; ++i) {
            if (n->leafAt(i)->type() == avro::AVRO_UNION) {
                os_ << "    typedef " << types[i]
                    << ' ' << n->nameAt(i) << "_t;\n";
            }
        }
    }
    for (size_t i = 0; i < c; ++i) {
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << "    " << n->nameAt(i) << "_t";
        } else {
            os_ << "    " << types[i];
        }
        os_ << ' ' << n->nameAt(i) << ";\n";
    }

    os_ << "    " << decoratedName << "()";
    if (c > 0) {
        os_ << " :";
    }
    os_ << "\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "        " << n->nameAt(i) << "(";
        if (! noUnion_ && n->leafAt(i)->type() == avro::AVRO_UNION) {
            os_ << n->nameAt(i) << "_t";
        } else {
            os_ << types[i];
        }
        os_ << "())";
        if (i != (c - 1)) {
            os_ << ',';
        }
        os_ << "\n";
    }
    os_ << "        { }\n";
    os_ << "};\n\n";
    return decorate(n->name());
}